

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

Reg __thiscall backend::codegen::Codegen::translate_value_to_reg(Codegen *this,Value *v)

{
  undefined2 uVar1;
  uint32_t uVar2;
  uint32_t num;
  Reg reg;
  Reg RVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> local_38;
  VarId local_30;
  
  if (v->field_0x18 == '\x01') {
    local_30.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    local_30.id = *(uint32_t *)&v->field_0x10;
    RVar3 = get_or_alloc_vgp(this,&local_30);
    reg = RVar3;
    if ((v->field_0x18 != '\0') && (v->shift_amount != '\0')) {
      uVar2 = this->vreg_gp_counter;
      this->vreg_gp_counter = uVar2 + 1;
      reg = arm::make_register(VirtualGeneralPurpose,uVar2);
      uVar1 = *(undefined2 *)&v->shift;
      local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
      *(Reg *)((long)local_38._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x28) = RVar3;
      *(undefined2 *)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x2c) = uVar1;
      *(undefined4 *)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = 6;
      *(undefined1 *)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = 0x10;
      *(undefined ***)
       local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0948;
      *(Reg *)((long)local_38._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10) = reg;
      *(undefined1 *)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined ***)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20) = &PTR_display_001f07d8
      ;
      *(undefined ***)
       ((long)local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838
      ;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_38)
      ;
      if ((_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)
          local_38._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl != (Inst *)0x0) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))();
      }
    }
  }
  else {
    if (v->field_0x18 != '\0') {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      puVar5 = (undefined8 *)operator_new(8);
      *puVar5 = &PTR__exception_001ef1c0;
      *puVar4 = puVar5;
      __cxa_throw(puVar4,&prelude::UnreachableException*::typeinfo,0);
    }
    uVar2 = *(uint32_t *)&v->field_0x8;
    num = this->vreg_gp_counter;
    this->vreg_gp_counter = num + 1;
    reg = arm::make_register(VirtualGeneralPurpose,num);
    make_number(this,reg,uVar2);
  }
  return reg;
}

Assistant:

arm::Reg Codegen::translate_value_to_reg(mir::inst::Value& v) {
  if (auto x = v.get_if<int32_t>()) {
    auto int_value = *x;
    auto reg = alloc_vgp();
    uint32_t imm_u = int_value;
    make_number(reg, imm_u);
    return reg;
  } else if (auto x = v.get_if<mir::inst::VarId>()) {
    auto reg = get_or_alloc_vgp(*x);
    if (v.has_shift()) {
      auto rd = alloc_vgp();
      inst.push_back(std::make_unique<Arith2Inst>(
          OpCode::Mov, rd, RegisterOperand(reg, v.shift, v.shift_amount)));
      return rd;
    } else {
      return reg;
    }
  } else {
    throw new prelude::UnreachableException();
  }
}